

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O0

void __thiscall
llm_build_xverse::llm_build_xverse
          (llm_build_xverse *this,llama_model *model,llm_graph_params *params,ggml_cgraph *gf)

{
  int il_00;
  ggml_tensor *pgVar1;
  ggml_tensor *pgVar2;
  ggml_tensor *pgVar3;
  ggml_tensor *pgVar4;
  ggml_tensor *pgVar5;
  ggml_tensor *pgVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  ggml_tensor *name;
  ggml_tensor *pgVar9;
  const_reference pvVar10;
  ggml_tensor *pgVar11;
  ggml_tensor *pgVar12;
  ggml_tensor *pgVar13;
  pointer plVar14;
  ggml_tensor *in_RCX;
  llm_graph_input_attn_kv_unified *in_RDX;
  llm_graph_context *in_RSI;
  long in_RDI;
  ggml_tensor *unaff_retaddr;
  ggml_tensor *in_stack_00000008;
  ggml_tensor *in_stack_00000010;
  ggml_tensor *in_stack_00000018;
  int in_stack_00000020;
  ggml_tensor *ffn_inp;
  ggml_tensor *inp_out_ids;
  ggml_tensor *Vcur;
  ggml_tensor *Kcur;
  ggml_tensor *Qcur;
  ggml_tensor *inpSA;
  int il;
  llm_graph_input_attn_kv_unified *inp_attn;
  ggml_tensor *inp_pos;
  ggml_tensor *inpL;
  ggml_tensor *cur;
  int64_t n_embd_head;
  ggml_tensor *in_stack_fffffffffffffdf8;
  int iVar15;
  llm_graph_context *in_stack_fffffffffffffe00;
  ggml_tensor *in_stack_fffffffffffffe08;
  ggml_tensor *cur_00;
  ggml_tensor *in_stack_fffffffffffffe10;
  ggml_tensor *mw;
  ggml_tensor *in_stack_fffffffffffffe18;
  undefined4 uVar16;
  llm_graph_context *in_stack_fffffffffffffe20;
  ggml_tensor *in_stack_fffffffffffffe50;
  ggml_tensor *in_stack_fffffffffffffe58;
  ggml_tensor *in_stack_fffffffffffffe60;
  ggml_tensor *pgVar17;
  ggml_tensor *in_stack_fffffffffffffe90;
  ggml_tensor *in_stack_fffffffffffffea0;
  ggml_tensor *in_stack_fffffffffffffeb0;
  ggml_tensor *in_stack_fffffffffffffeb8;
  ggml_tensor *in_stack_fffffffffffffec0;
  llm_ffn_op_type type_op;
  llm_ffn_gate_type type_gate;
  ggml_tensor *in_stack_ffffffffffffff08;
  llm_graph_context *in_stack_ffffffffffffff10;
  ggml_tensor *local_68;
  int local_5c;
  ggml_tensor *local_48;
  float kq_scale;
  ggml_tensor *in_stack_ffffffffffffffc8;
  ggml_tensor *in_stack_ffffffffffffffd0;
  
  llm_graph_context::llm_graph_context
            ((llm_graph_context *)in_stack_fffffffffffffe10,
             (llm_graph_params *)in_stack_fffffffffffffe08);
  pgVar1 = (ggml_tensor *)(ulong)*(uint *)(*(long *)(in_RDI + 8) + 0x24);
  if (pgVar1 != (ggml_tensor *)(ulong)*(uint *)(*(long *)(in_RDI + 8) + 0x20)) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
               ,0x1345,"GGML_ASSERT(%s) failed","n_embd_head == hparams.n_embd_head_k");
  }
  if (pgVar1 != (ggml_tensor *)(ulong)*(uint *)(*(long *)(in_RDI + 8) + 0x14)) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
               ,0x1346,"GGML_ASSERT(%s) failed","n_embd_head == hparams.n_rot");
  }
  local_48 = llm_graph_context::build_inp_embd(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  pgVar2 = llm_graph_context::build_inp_pos((llm_graph_context *)in_stack_fffffffffffffe60);
  pgVar3 = (ggml_tensor *)
           llm_graph_context::build_attn_inp_kv_unified
                     ((llm_graph_context *)in_stack_fffffffffffffea0);
  for (local_5c = 0; iVar15 = (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20),
      (long)local_5c < *(long *)(in_RDI + 0x28); local_5c = local_5c + 1) {
    local_68 = local_48;
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)&in_RSI[0x19].ubatch,
               (long)local_5c);
    pgVar4 = llm_graph_context::build_norm
                       (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                        in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                        (llm_norm_type)((ulong)in_stack_fffffffffffffe00 >> 0x20),
                        (int)in_stack_fffffffffffffe00);
    kq_scale = (float)((ulong)pgVar4 >> 0x20);
    uVar16 = (undefined4)((ulong)in_stack_fffffffffffffe18 >> 0x20);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
               (char *)in_stack_fffffffffffffe00,iVar15);
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)&in_RSI[0x19].ubatch,
               (long)local_5c);
    pgVar4 = llm_graph_context::build_lora_mm
                       ((llm_graph_context *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                        in_stack_fffffffffffffe50);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
               (char *)in_stack_fffffffffffffe00,iVar15);
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)&in_RSI[0x19].ubatch,
               (long)local_5c);
    pgVar5 = llm_graph_context::build_lora_mm
                       ((llm_graph_context *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                        in_stack_fffffffffffffe50);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
               (char *)in_stack_fffffffffffffe00,iVar15);
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)&in_RSI[0x19].ubatch,
               (long)local_5c);
    pgVar6 = llm_graph_context::build_lora_mm
                       ((llm_graph_context *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                        in_stack_fffffffffffffe50);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
               (char *)in_stack_fffffffffffffe00,iVar15);
    uVar7 = ggml_reshape_3d(*(undefined8 *)(in_RDI + 0xc0),pgVar4,pgVar1,
                            *(undefined8 *)(in_RDI + 0x48),(long)*(int *)(in_RDI + 0xa8));
    uVar8 = ggml_reshape_3d(*(undefined8 *)(in_RDI + 0xc0),pgVar5,pgVar1,
                            *(undefined8 *)(in_RDI + 0x50),(long)*(int *)(in_RDI + 0xa8));
    name = (ggml_tensor *)
           ggml_reshape_3d(*(undefined8 *)(in_RDI + 0xc0),pgVar6,pgVar1,
                           *(undefined8 *)(in_RDI + 0x50),(long)*(int *)(in_RDI + 0xa8));
    il_00 = ggml_rope_ext(*(undefined4 *)(in_RDI + 0x88),*(undefined4 *)(in_RDI + 0x8c),
                          *(undefined4 *)(in_RDI + 0x90),*(undefined4 *)(in_RDI + 0x94),
                          *(undefined4 *)(in_RDI + 0x98),*(undefined4 *)(in_RDI + 0x9c),
                          *(undefined8 *)(in_RDI + 0xc0),uVar7,pgVar2,0,
                          *(undefined4 *)(in_RDI + 0x30),*(undefined4 *)(in_RDI + 0xb8));
    pgVar9 = (ggml_tensor *)
             ggml_rope_ext(*(undefined4 *)(in_RDI + 0x88),*(undefined4 *)(in_RDI + 0x8c),
                           *(undefined4 *)(in_RDI + 0x90),*(undefined4 *)(in_RDI + 0x94),
                           *(undefined4 *)(in_RDI + 0x98),*(undefined4 *)(in_RDI + 0x9c),
                           *(undefined8 *)(in_RDI + 0xc0),uVar8,pgVar2,0,
                           *(undefined4 *)(in_RDI + 0x30),*(undefined4 *)(in_RDI + 0xb8));
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
               (char *)in_stack_fffffffffffffe00,iVar15);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
               (char *)in_stack_fffffffffffffe00,iVar15);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
               (char *)in_stack_fffffffffffffe00,iVar15);
    pgVar6 = pgVar3;
    pgVar17 = in_RCX;
    pvVar10 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                        ((vector<llama_layer,_std::allocator<llama_layer>_> *)&in_RSI[0x19].ubatch,
                         (long)local_5c);
    type_op = (llm_ffn_op_type)in_RCX;
    type_gate = (llm_ffn_gate_type)pvVar10->wo;
    sqrtf((float)(long)pgVar1);
    pgVar13 = (ggml_tensor *)CONCAT44(uVar16,local_5c);
    mw = (ggml_tensor *)0x0;
    cur_00 = (ggml_tensor *)0x0;
    pgVar4 = name;
    pgVar5 = pgVar9;
    pgVar11 = llm_graph_context::build_attn
                        (in_RSI,in_RDX,(ggml_cgraph *)pgVar17,pgVar1,in_stack_ffffffffffffffd0,
                         in_stack_ffffffffffffffc8,unaff_retaddr,in_stack_00000008,in_stack_00000010
                         ,in_stack_00000018,kq_scale,in_stack_00000020);
    iVar15 = (int)((ulong)pgVar9 >> 0x20);
    in_RCX = pgVar17;
    if ((long)local_5c == *(long *)(in_RDI + 0x28) + -1) {
      pgVar9 = llm_graph_context::build_inp_out_ids((llm_graph_context *)in_stack_fffffffffffffe50);
      in_stack_fffffffffffffec0 = pgVar9;
      in_stack_fffffffffffffeb8 =
           (ggml_tensor *)ggml_get_rows(*(undefined8 *)(in_RDI + 0xc0),pgVar11,pgVar9);
      pgVar11 = in_stack_fffffffffffffeb8;
      in_stack_fffffffffffffeb0 =
           (ggml_tensor *)ggml_get_rows(*(undefined8 *)(in_RDI + 0xc0),local_48,pgVar9);
      local_68 = in_stack_fffffffffffffeb0;
      in_RCX = pgVar17;
    }
    pgVar12 = (ggml_tensor *)ggml_add(*(undefined8 *)(in_RDI + 0xc0),pgVar11,local_68);
    llm_graph_context::cb((llm_graph_context *)mw,cur_00,(char *)name,iVar15);
    pgVar9 = pgVar12;
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)&in_RSI[0x19].ubatch,
               (long)local_5c);
    pgVar13 = llm_graph_context::build_norm
                        (in_stack_fffffffffffffe20,pgVar13,mw,cur_00,
                         (llm_norm_type)((ulong)name >> 0x20),(int)name);
    llm_graph_context::cb((llm_graph_context *)mw,cur_00,(char *)name,iVar15);
    pvVar10 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                        ((vector<llama_layer,_std::allocator<llama_layer>_> *)&in_RSI[0x19].ubatch,
                         (long)local_5c);
    pgVar11 = pvVar10->ffn_up;
    pvVar10 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                        ((vector<llama_layer,_std::allocator<llama_layer>_> *)&in_RSI[0x19].ubatch,
                         (long)local_5c);
    pgVar17 = pvVar10->ffn_gate;
    pvVar10 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                        ((vector<llama_layer,_std::allocator<llama_layer>_> *)&in_RSI[0x19].ubatch,
                         (long)local_5c);
    in_stack_fffffffffffffe08 = pvVar10->ffn_down;
    in_stack_fffffffffffffe20 = (llm_graph_context *)0x0;
    in_stack_fffffffffffffe18 = (ggml_tensor *)0x0;
    in_stack_fffffffffffffe10 = (ggml_tensor *)0x0;
    in_stack_fffffffffffffe00 = (llm_graph_context *)0x0;
    in_stack_fffffffffffffdf8 = (ggml_tensor *)0x0;
    in_stack_fffffffffffffe90 =
         llm_graph_context::build_ffn
                   ((llm_graph_context *)pgVar13,pgVar9,in_stack_fffffffffffffe90,
                    (ggml_tensor *)&stack0xfffffffffffffdf8,pgVar17,pgVar11,
                    in_stack_fffffffffffffeb0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffec0,
                    pgVar4,pgVar5,pgVar6,type_op,type_gate,il_00);
    pgVar4 = in_stack_fffffffffffffe90;
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
               (char *)in_stack_fffffffffffffe00,(int)((ulong)in_stack_fffffffffffffdf8 >> 0x20));
    ggml_add(*(undefined8 *)(in_RDI + 0xc0),pgVar4,pgVar12);
    in_stack_fffffffffffffe60 =
         llm_graph_context::build_cvec(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,0);
    local_48 = in_stack_fffffffffffffe60;
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
               (char *)in_stack_fffffffffffffe00,(int)((ulong)in_stack_fffffffffffffdf8 >> 0x20));
  }
  pgVar2 = llm_graph_context::build_norm
                     (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                      in_stack_fffffffffffffe08,
                      (llm_norm_type)((ulong)in_stack_fffffffffffffe00 >> 0x20),
                      (int)in_stack_fffffffffffffe00);
  pgVar1 = pgVar2;
  llm_graph_context::cb
            ((llm_graph_context *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
             (char *)in_stack_fffffffffffffe00,iVar15);
  plVar14 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                      ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
                       0x4e134d);
  plVar14->t_embd = pgVar1;
  pgVar2 = llm_graph_context::build_lora_mm
                     ((llm_graph_context *)in_stack_fffffffffffffe60,pgVar2,
                      in_stack_fffffffffffffe50);
  llm_graph_context::cb
            ((llm_graph_context *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
             (char *)in_stack_fffffffffffffe00,iVar15);
  pgVar1 = pgVar2;
  plVar14 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                      ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
                       0x4e13d2);
  plVar14->t_logits = pgVar2;
  ggml_build_forward_expand(in_RCX,pgVar1);
  return;
}

Assistant:

llm_build_xverse(const llama_model & model, const llm_graph_params & params, ggml_cgraph * gf) : llm_graph_context(params) {
        const int64_t n_embd_head = hparams.n_embd_head_v;

        GGML_ASSERT(n_embd_head == hparams.n_embd_head_k);
        GGML_ASSERT(n_embd_head == hparams.n_rot);

        ggml_tensor * cur;
        ggml_tensor * inpL;

        inpL = build_inp_embd(model.tok_embd);

        // inp_pos - contains the positions
        ggml_tensor * inp_pos = build_inp_pos();

        auto * inp_attn = build_attn_inp_kv_unified();

        for (int il = 0; il < n_layer; ++il) {
            ggml_tensor * inpSA = inpL;

            cur = build_norm(inpL,
                    model.layers[il].attn_norm, NULL,
                    LLM_NORM_RMS, il);
            cb(cur, "attn_norm", il);

            // self-attention
            {
                ggml_tensor * Qcur = build_lora_mm(model.layers[il].wq, cur);
                cb(Qcur, "Qcur", il);

                ggml_tensor * Kcur = build_lora_mm(model.layers[il].wk, cur);
                cb(Kcur, "Kcur", il);

                ggml_tensor * Vcur = build_lora_mm(model.layers[il].wv, cur);
                cb(Vcur, "Vcur", il);

                Qcur = ggml_reshape_3d(ctx0, Qcur, n_embd_head, n_head,    n_tokens);
                Kcur = ggml_reshape_3d(ctx0, Kcur, n_embd_head, n_head_kv, n_tokens);
                Vcur = ggml_reshape_3d(ctx0, Vcur, n_embd_head, n_head_kv, n_tokens);

                Qcur = ggml_rope_ext(
                        ctx0, Qcur, inp_pos, nullptr,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                        );

                Kcur = ggml_rope_ext(
                        ctx0, Kcur, inp_pos, nullptr,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                        );

                cb(Qcur, "Qcur", il);
                cb(Kcur, "Kcur", il);
                cb(Vcur, "Vcur", il);

                cur = build_attn(inp_attn, gf,
                        model.layers[il].wo, NULL,
                        Qcur, Kcur, Vcur, nullptr, nullptr, 1.0f/sqrtf(float(n_embd_head)), il);
            }

            if (il == n_layer - 1) {
                // skip computing output for unused tokens
                ggml_tensor * inp_out_ids = build_inp_out_ids();
                cur   = ggml_get_rows(ctx0,   cur, inp_out_ids);
                inpSA = ggml_get_rows(ctx0, inpSA, inp_out_ids);
            }

            ggml_tensor * ffn_inp = ggml_add(ctx0, cur, inpSA);
            cb(ffn_inp, "ffn_inp", il);

            // feed-forward network
            {
                cur = build_norm(ffn_inp,
                        model.layers[il].ffn_norm, NULL,
                        LLM_NORM_RMS, il);
                cb(cur, "ffn_norm", il);

                cur = build_ffn(cur,
                        model.layers[il].ffn_up,   NULL, NULL,
                        model.layers[il].ffn_gate, NULL, NULL,
                        model.layers[il].ffn_down, NULL, NULL,
                        NULL,
                        LLM_FFN_SILU, LLM_FFN_PAR, il);
                cb(cur, "ffn_out", il);
            }

            cur = ggml_add(ctx0, cur, ffn_inp);

            cur = build_cvec(cur, il);
            cb(cur, "l_out", il);

            // input for next layer
            inpL = cur;
        }

        cur = inpL;

        cur = build_norm(cur, model.output_norm, NULL, LLM_NORM_RMS, -1);

        cb(cur, "result_norm", -1);
        res->t_embd = cur;

        // lm_head
        cur = build_lora_mm(model.output, cur);

        cb(cur, "result_output", -1);
        res->t_logits = cur;

        ggml_build_forward_expand(gf, cur);
    }